

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O1

AggregateFunction * duckdb::ApproxTopKFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_b9;
  LogicalType local_b8 [24];
  LogicalType local_a0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_88;
  string local_70;
  LogicalType local_50 [24];
  LogicalType local_38 [24];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"approx_top_k","");
  duckdb::LogicalType::LogicalType(local_50,ANY);
  duckdb::LogicalType::LogicalType(local_38,BIGINT);
  __l._M_len = 2;
  __l._M_array = local_50;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_88,__l,&local_b9);
  duckdb::LogicalType::LogicalType(local_b8,ANY);
  duckdb::LogicalType::LIST(local_a0);
  AggregateFunction::AggregateFunction
            (in_RDI,&local_70,(vector<duckdb::LogicalType,_true> *)&local_88,local_a0,
             AggregateFunction::StateSize<duckdb::ApproxTopKState>,
             AggregateFunction::
             StateInitialize<duckdb::ApproxTopKState,duckdb::ApproxTopKOperation,(duckdb::AggregateDestructorType)0>
             ,ApproxTopKUpdate<duckdb::string_t,duckdb::HistogramGenericFunctor>,
             AggregateFunction::StateCombine<duckdb::ApproxTopKState,duckdb::ApproxTopKOperation>,
             ApproxTopKFinalize<duckdb::HistogramGenericFunctor>,(aggregate_simple_update_t)0x0,
             ApproxTopKBind,
             AggregateFunction::StateDestroy<duckdb::ApproxTopKState,duckdb::ApproxTopKOperation>,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  duckdb::LogicalType::~LogicalType(local_a0);
  duckdb::LogicalType::~LogicalType(local_b8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_88);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_50 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

AggregateFunction ApproxTopKFun::GetFunction() {
	using STATE = ApproxTopKState;
	using OP = ApproxTopKOperation;
	return AggregateFunction("approx_top_k", {LogicalTypeId::ANY, LogicalType::BIGINT},
	                         LogicalType::LIST(LogicalType::ANY), AggregateFunction::StateSize<STATE>,
	                         AggregateFunction::StateInitialize<STATE, OP>, ApproxTopKUpdate,
	                         AggregateFunction::StateCombine<STATE, OP>, ApproxTopKFinalize, nullptr, ApproxTopKBind,
	                         AggregateFunction::StateDestroy<STATE, OP>);
}